

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void renumber_script_commands(Am_Value_List *orig_cmds)

{
  bool bVar1;
  Am_Value *in_value;
  int value;
  Am_Object this_cmd;
  Am_Object local_28;
  
  local_28.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(orig_cmds);
  value = 1;
  while( true ) {
    bVar1 = Am_Value_List::Last(orig_cmds);
    if (bVar1) break;
    in_value = Am_Value_List::Get(orig_cmds);
    Am_Object::operator=(&local_28,in_value);
    Am_Object::Set(&local_28,Am_COMMAND_INDEX_IN_SCRIPT,value,1);
    Am_Value_List::Next(orig_cmds);
    value = value + 1;
  }
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
renumber_script_commands(Am_Value_List &orig_cmds)
{
  int i = 1;
  Am_Object this_cmd;
  for (orig_cmds.Start(); !orig_cmds.Last(); orig_cmds.Next(), i++) {
    this_cmd = orig_cmds.Get();
    this_cmd.Set(Am_COMMAND_INDEX_IN_SCRIPT, i, Am_OK_IF_NOT_THERE);
  }
}